

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layers.c
# Opt level: O2

int mapContinent(Layer *l,int *out,int x,int z,int w,int h)

{
  uint64_t ss;
  undefined1 auVar1 [16];
  long lVar2;
  uint64_t uVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  int *piVar8;
  
  ss = l->startSeed;
  lVar2 = (long)w;
  uVar4 = 0;
  lVar5 = 0;
  if (0 < lVar2) {
    lVar5 = lVar2;
  }
  uVar6 = 0;
  piVar8 = out;
  if (0 < h) {
    uVar6 = (ulong)(uint)h;
  }
  for (; uVar4 != uVar6; uVar4 = uVar4 + 1) {
    for (lVar7 = 0; lVar5 != lVar7; lVar7 = lVar7 + 1) {
      uVar3 = getChunkSeed(ss,x + (int)lVar7,(int)uVar4 + z);
      auVar1._8_8_ = (long)uVar3 >> 0x3f;
      auVar1._0_8_ = (long)uVar3 >> 0x18;
      piVar8[lVar7] = (uint)(SUB168(auVar1 % SEXT816(10),0) == 0);
    }
    piVar8 = piVar8 + lVar2;
  }
  if ((x < 1 && -w < x) && (z < 1 && -h < z)) {
    out[lVar2 * (ulong)(uint)-z - (long)x] = 1;
  }
  return 0;
}

Assistant:

int mapContinent(const Layer * l, int * out, int x, int z, int w, int h)
{
    uint64_t ss = l->startSeed;
    uint64_t cs;
    int64_t i, j;

    for (j = 0; j < h; j++)
    {
        for (i = 0; i < w; i++)
        {
            cs = getChunkSeed(ss, i + x, j + z);
            out[j*w + i] = mcFirstIsZero(cs, 10);
        }
    }

    if (x > -w && x <= 0 && z > -h && z <= 0)
    {
        out[-z * (int64_t)w - x] = 1;
    }

    return 0;
}